

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

int fy_emit_push_state(fy_emitter *emit,fy_emitter_state state)

{
  uint uVar1;
  fy_emitter_state *__dest;
  fy_emitter_state *local_30;
  fy_emitter_state *states;
  fy_emitter_state state_local;
  fy_emitter *emit_local;
  
  if (emit->state_stack_alloc <= emit->state_stack_top) {
    if (emit->state_stack == emit->state_stack_inplace) {
      local_30 = (fy_emitter_state *)0x0;
    }
    else {
      local_30 = emit->state_stack;
    }
    __dest = (fy_emitter_state *)realloc(local_30,(ulong)emit->state_stack_alloc << 3);
    if (state == FYES_NONE) {
      return -1;
    }
    if (emit->state_stack == emit->state_stack_inplace) {
      memcpy(__dest,emit->state_stack,(ulong)emit->state_stack_top << 2);
    }
    emit->state_stack = __dest;
    emit->state_stack_alloc = emit->state_stack_alloc << 1;
  }
  uVar1 = emit->state_stack_top;
  emit->state_stack_top = uVar1 + 1;
  emit->state_stack[uVar1] = state;
  return 0;
}

Assistant:

static int fy_emit_push_state(struct fy_emitter *emit, enum fy_emitter_state state) {
    enum fy_emitter_state *states;

    if (emit->state_stack_top >= emit->state_stack_alloc) {
        states = realloc(emit->state_stack == emit->state_stack_inplace ? NULL : emit->state_stack,
                         sizeof(emit->state_stack[0]) * emit->state_stack_alloc * 2);
        if (!state)
            return -1;

        if (emit->state_stack == emit->state_stack_inplace)
            memcpy(states, emit->state_stack, sizeof(emit->state_stack[0]) * emit->state_stack_top);
        emit->state_stack = states;
        emit->state_stack_alloc *= 2;
    }
    emit->state_stack[emit->state_stack_top++] = state;

    return 0;
}